

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double dirichlet_pdf(double *x,int n,double *a)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double local_38;
  
  uVar3 = (ulong)(uint)n;
  if (0 < n) {
    uVar1 = 0;
    do {
      if (x[uVar1] <= 0.0) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_PDF - Fatal error!\n");
        pcVar2 = "  X(I) <= 0.\n";
        goto LAB_00199535;
      }
      uVar1 = uVar1 + 1;
    } while (uVar3 != uVar1);
  }
  dVar4 = r8vec_sum(n,x);
  if (ABS(dVar4 + -1.0) <= 0.0001) {
    dVar4 = r8vec_sum(n,a);
    if (0 < n) {
      local_38 = 1.0;
      uVar1 = 0;
      do {
        dVar5 = tgamma(a[uVar1]);
        local_38 = local_38 * dVar5;
        uVar1 = uVar1 + 1;
      } while (uVar3 != uVar1);
      dVar4 = tgamma(dVar4);
      dVar4 = dVar4 / local_38;
      if (0 < n) {
        uVar1 = 0;
        do {
          dVar5 = pow(x[uVar1],a[uVar1] + -1.0);
          dVar4 = dVar4 * dVar5;
          uVar1 = uVar1 + 1;
        } while (uVar3 != uVar1);
      }
      return dVar4;
    }
    dVar4 = tgamma(dVar4);
    return dVar4;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DIRICHLET_PDF - Fatal error!\n");
  pcVar2 = "  SUM X(I) =/= 1.\n";
LAB_00199535:
  std::operator<<((ostream *)&std::cerr,pcVar2);
  exit(1);
}

Assistant:

double dirichlet_pdf ( double x[], int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_PDF evaluates the Dirichlet PDF.
//
//  Discussion:
//
//    PDF(N,A;X) = Product ( 1 <= I <= N ) X(I)^( A(I) - 1 )
//      * Gamma ( A_SUM ) / A_PROD
//
//    where
//
//      0 < A(I) for all I;
//      0 <= X(I) for all I;
//      Sum ( 1 <= I <= N ) X(I) = 1;
//      A_SUM = Sum ( 1 <= I <= N ) A(I).
//      A_PROD = Product ( 1 <= I <= N ) Gamma ( A(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X(N), the argument of the PDF.  Each X(I) should
//    be greater than 0.0, and the X(I)'s must add up to 1.0.
//
//    Input, int N, the number of components.
//
//    Input, double A(N), the probabilities for each component.
//    Each A(I) should be positive.
//
//    Output, double PDF, the value of the PDF.
//
{
  double a_prod;
  double a_sum;
  int i;
  double pdf;
  double tol = 0.0001;
  double x_sum;

  for ( i = 0; i < n; i++ )
  {
    if ( x[i] <= 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_PDF - Fatal error!\n";
      cerr << "  X(I) <= 0.\n";
      exit ( 1 );
    }
  }

  x_sum = r8vec_sum ( n, x );

  if ( tol < fabs ( x_sum - 1.0 ) )
  {
    cerr << " \n";
    cerr << "DIRICHLET_PDF - Fatal error!\n";
    cerr << "  SUM X(I) =/= 1.\n";
    exit ( 1 );
  }

  a_sum = r8vec_sum ( n, a );

  a_prod = 1.0;
  for ( i = 0; i < n; i++ )
  {
    a_prod = a_prod * tgamma ( a[i] );
  }

  pdf = tgamma ( a_sum ) / a_prod;

  for ( i = 0; i < n; i++ )
  {
    pdf = pdf * pow ( x[i], a[i] - 1.0 );
  }

  return pdf;
}